

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * unpack7_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x7f) + base;
  out[1] = (*in >> 7 & 0x7f) + base;
  out[2] = (*in >> 0xe & 0x7f) + base;
  out[3] = (*in >> 0x15 & 0x7f) + base;
  uVar1 = *in;
  out[4] = uVar1 >> 0x1c;
  out[4] = (uVar1 >> 0x1c) + base + (in[1] & 7) * 0x10;
  out[5] = (in[1] >> 3 & 0x7f) + base;
  out[6] = (in[1] >> 10 & 0x7f) + base;
  out[7] = (in[1] >> 0x11 & 0x7f) + base;
  return in + 2;
}

Assistant:

uint32_t * unpack7_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  7  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  14  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  21  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 3 ))<<( 7 - 3 );
    *out += base;
    out++;
    *out = ( (*in) >>  3  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 7 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  17  )   % (1U << 7 )  ;
    *out += base;
    out++;

    return in + 1;
}